

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeStructType(Builder *this,Vector<Id> *members,char *name)

{
  pointer *pppIVar1;
  iterator __position;
  iterator __position_00;
  pointer puVar2;
  Id IVar3;
  long lVar4;
  Instruction *type;
  Instruction *local_38;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  
  local_38 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  IVar3 = this->uniqueId + 1;
  this->uniqueId = IVar3;
  local_38->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
  local_38->resultId = IVar3;
  local_38->typeId = 0;
  local_38->opCode = OpTypeStruct;
  (local_38->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_38->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_38->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38->block = (Block *)0x0;
  puVar2 = (members->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(members->
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2)) {
    lVar4 = 0;
    do {
      local_30._M_head_impl._0_4_ = puVar2[lVar4];
      __position._M_current =
           (local_38->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_38->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &local_38->operands,__position,(uint *)&local_30);
      }
      else {
        *__position._M_current = puVar2[lVar4];
        (local_38->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar4 = lVar4 + 1;
      puVar2 = (members->
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (lVar4 < (int)((ulong)((long)(members->
                                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2)
                          >> 2));
  }
  __position_00._M_current =
       this->groupedTypes[0x1e].
       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      this->groupedTypes[0x1e].
      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>
              ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
               (this->groupedTypes + 0x1e),__position_00,&local_38);
  }
  else {
    *__position_00._M_current = local_38;
    pppIVar1 = &this->groupedTypes[0x1e].
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  local_30._M_head_impl = local_38;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
  if (local_30._M_head_impl != (Instruction *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,local_38);
  addName(this,local_38->resultId,name);
  return local_38->resultId;
}

Assistant:

Id Builder::makeStructType(const dxil_spv::Vector<Id>& members, const char* name)
{
    // Don't look for previous one, because in the general case,
    // structs can be duplicated except for decorations.

    // not found, make it
    Instruction* type = new Instruction(getUniqueId(), NoType, OpTypeStruct);
    for (int op = 0; op < (int)members.size(); ++op)
        type->addIdOperand(members[op]);
    groupedTypes[OpTypeStruct].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);
    addName(type->getResultId(), name);

    return type->getResultId();
}